

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execBcc<(moira::Core)2,(moira::Instr)18,(moira::Mode)12,4>(Moira *this,u16 opcode)

{
  StackFrame frame;
  u32 uVar1;
  bool bVar2;
  i32 iVar3;
  AddressError *this_00;
  StackFrame local_38;
  u32 local_20;
  uint local_1c;
  u32 newpc;
  u32 disp;
  u32 oldpc;
  u16 opcode_local;
  Moira *this_local;
  
  this->cp = 0;
  newpc = (this->reg).pc;
  disp._2_2_ = opcode;
  _oldpc = this;
  bVar2 = cond<(moira::Instr)18>(this);
  if (bVar2) {
    local_1c = (uint)(this->queue).irc;
    readExt<(moira::Core)2>(this);
    uVar1 = newpc;
    local_1c = local_1c << 0x10 | (uint)(this->queue).irc;
    iVar3 = SEXT<4>((ulong)local_1c);
    local_20 = uVar1 + iVar3;
    bVar2 = misaligned<(moira::Core)2,2>(this,local_20);
    if (bVar2) {
      this_00 = (AddressError *)__cxa_allocate_exception(0x20);
      makeFrame<0ull>(&local_38,this,local_20);
      frame.ird = local_38.ird;
      frame.sr = local_38.sr;
      frame.pc = local_38.pc;
      frame.code = local_38.code;
      frame._2_2_ = local_38._2_2_;
      frame.addr = local_38.addr;
      frame.fc = local_38.fc;
      frame.ssw = local_38.ssw;
      AddressError::AddressError(this_00,frame);
      __cxa_throw(this_00,&AddressError::typeinfo,AddressError::~AddressError);
    }
    (this->reg).pc = local_20;
    fullPrefetch<(moira::Core)2,4ull,0>(this);
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 6));
  }
  else {
    readExt<(moira::Core)2>(this);
    readExt<(moira::Core)2>(this);
    prefetch<(moira::Core)2,4ull>(this);
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 6));
  }
  return;
}

Assistant:

void
Moira::execBcc(u16 opcode)
{
    AVAILABILITY(S == Long ? Core::C68020 : Core::C68000)

    u32 oldpc = reg.pc;

    SYNC(2);

    if (cond<I>()) {

        u32 disp = S == Byte ? (u8)opcode : queue.irc;

        if (S == Long) {

            readExt<C>();
            disp = disp << 16 | queue.irc;
        }

        u32 newpc = U32_ADD(oldpc, SEXT<S>(disp));

        // Check for address error
        if (misaligned<C>(newpc)) {
            throw AddressError(makeFrame(newpc));
        }

        // Take branch
        reg.pc = newpc;
        fullPrefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   (10, 10,  6,       10, 10,  6,        0,  0,  6)

    } else {

        // Fall through to next instruction
        if constexpr (C == Core::C68000) SYNC(2);
        if constexpr (S == Word || S == Long) readExt<C>();
        if constexpr (S == Long) readExt<C>();
        prefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   ( 8,  6,  4,       12, 10,  6,        0,  0,  6)
    }

    FINALIZE
}